

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_int>(XmlWriter *this,string *name,uint *attribute)

{
  XmlWriter *pXVar1;
  ostringstream local_1c0 [8];
  ostringstream oss;
  string local_48;
  
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
  std::__cxx11::stringbuf::str();
  pXVar1 = writeAttribute(this,name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }